

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O2

int MRIStepComputeState(void *arkode_mem,N_Vector zcor,N_Vector z)

{
  int iVar1;
  ARKodeMRIStepMem step_mem;
  ARKodeMem ark_mem;
  ARKodeMRIStepMem local_28;
  ARKodeMem local_20;
  
  iVar1 = mriStep_AccessStepMem(arkode_mem,"MRIStepComputeState",&local_20,&local_28);
  if (iVar1 == 0) {
    N_VLinearSum(1.0,local_28->zpred,1.0,zcor,z);
  }
  return iVar1;
}

Assistant:

int MRIStepComputeState(void *arkode_mem, N_Vector zcor, N_Vector z)
{
  int retval;
  ARKodeMem ark_mem;
  ARKodeMRIStepMem step_mem;

  /* access ARKodeMRIStepMem structure */
  retval = mriStep_AccessStepMem(arkode_mem, "MRIStepComputeState",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS) return(retval);

  N_VLinearSum(ONE, step_mem->zpred, ONE, zcor, z);

  return(ARK_SUCCESS);
}